

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.hpp
# Opt level: O1

void __thiscall
helics::apps::AsioBrokerServer::AsioBrokerServer(AsioBrokerServer *this,string_view server_name)

{
  (this->super_TypedBrokerServer)._vptr_TypedBrokerServer =
       (_func_int **)&PTR__AsioBrokerServer_0054ef20;
  memset(&this->tcpserver,0,0x88);
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->name_,server_name._M_str,server_name._M_str + server_name._M_len);
  this->tcp_enabled_ = false;
  this->udp_enabled_ = false;
  return;
}

Assistant:

explicit AsioBrokerServer(std::string_view server_name): name_(server_name) {}